

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_a_star.cpp
# Opt level: O1

void __thiscall
IDAStarSearch::IDAStarSearch(IDAStarSearch *this,ifstream *ifs,Point *maze_entry,Point *maze_target)

{
  Search::Search(&this->super_Search,ifs,maze_entry,maze_target);
  (this->super_Search)._vptr_Search = (_func_int **)&PTR_maze_search_00107d88;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->frontier).super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>::
  _M_initialize_map(&(this->frontier).
                     super__Deque_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
                    ,0);
  return;
}

Assistant:

IDAStarSearch::IDAStarSearch(ifstream &ifs, const Point &maze_entry, const Point &maze_target) : Search(ifs, maze_entry,
                                                                                                        maze_target) {}